

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

void luaH_resize(lua_State *L,Table *t,uint nasize,uint nhsize)

{
  ushort uVar1;
  uint size;
  Node *block;
  GCObject *pGVar2;
  int iVar3;
  TValue *pTVar4;
  TValue *pTVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  AuxsetnodeT asn;
  Table *local_40;
  uint local_38;
  
  size = t->sizearray;
  if (t->lastfree == (Node *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 1 << (t->lsizenode & 0x1f);
  }
  block = t->node;
  if (size < nasize) {
    setarrayvector(L,t,nasize);
  }
  local_40 = t;
  local_38 = nhsize;
  iVar3 = luaD_rawrunprotected(L,auxsetnode,&local_40);
  if (iVar3 == 0) {
    if (nasize < size) {
      uVar8 = (ulong)nasize;
      t->sizearray = nasize;
      lVar9 = uVar8 << 4;
      uVar6 = uVar8;
      do {
        uVar6 = uVar6 + 1;
        if (*(short *)((long)&t->array->tt_ + lVar9) != 0) {
          luaH_setint(L,t,uVar6,(TValue *)((long)&t->array->value_ + lVar9));
        }
        lVar9 = lVar9 + 0x10;
      } while ((1 - (ulong)size) + uVar6 != 1);
      pTVar4 = (TValue *)luaM_realloc_(L,t->array,(ulong)size << 4,uVar8 << 4);
      t->array = pTVar4;
    }
    if (0 < (int)uVar7) {
      uVar8 = (ulong)uVar7;
      uVar6 = uVar8 + 1;
      pTVar4 = (TValue *)&block[uVar8 - 1].i_key;
      do {
        if (pTVar4[-1].tt_ != 0) {
          pTVar5 = luaH_set(L,t,pTVar4);
          pGVar2 = pTVar4[-1].value_.gc;
          (pTVar5->value_).gc = pGVar2;
          uVar1 = pTVar4[-1].tt_;
          pTVar5->tt_ = uVar1;
          if (((short)uVar1 < 0) &&
             (((uVar1 & 0x7f) != (ushort)pGVar2->tt ||
              ((L != (lua_State *)0x0 && ((pGVar2->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))
             ) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                          ,0x1c5,
                          "void luaH_resize(lua_State *, Table *, unsigned int, unsigned int)");
          }
        }
        uVar6 = uVar6 - 1;
        pTVar4 = pTVar4 + -2;
      } while (1 < uVar6);
      if (0 < (int)uVar7) {
        luaM_realloc_(L,block,uVar8 << 5,0);
      }
    }
    return;
  }
  setarrayvector(L,t,size);
  luaD_throw(L,4);
}

Assistant:

void luaH_resize (lua_State *L, Table *t, unsigned int nasize,
                                          unsigned int nhsize) {
  unsigned int i;
  int j;
  AuxsetnodeT asn;
  unsigned int oldasize = t->sizearray;
  int oldhsize = allocsizenode(t);
  Node *nold = t->node;  /* save old hash ... */
  if (nasize > oldasize)  /* array part must grow? */
    setarrayvector(L, t, nasize);
  /* create new hash part with appropriate size */
  asn.t = t; asn.nhsize = nhsize;
  if (luaD_rawrunprotected(L, auxsetnode, &asn) != LUA_OK) {  /* mem. error? */
    setarrayvector(L, t, oldasize);  /* array back to its original size */
    luaD_throw(L, LUA_ERRMEM);  /* rethrow memory error */
  }
  if (nasize < oldasize) {  /* array part must shrink? */
    t->sizearray = nasize;
    /* re-insert elements from vanishing slice */
    for (i=nasize; i<oldasize; i++) {
      if (!ttisnil(&t->array[i]))
        luaH_setint(L, t, i + 1, &t->array[i]);
    }
    /* shrink array */
    luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
  }
  /* re-insert elements from hash part */
  for (j = oldhsize - 1; j >= 0; j--) {
    Node *old = nold + j;
    if (!ttisnil(gval(old))) {
      /* doesn't need barrier/invalidate cache, as entry was
         already present in the table */
      setobjt2t(L, luaH_set(L, t, gkey(old)), gval(old));
    }
  }
  if (oldhsize > 0)  /* not the dummy node? */
    luaM_freearray(L, nold, cast(size_t, oldhsize)); /* free old hash */
}